

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O2

Io_MvMod_t * Io_MvModAlloc(void)

{
  Io_MvMod_t *pIVar1;
  Vec_Ptr_t *pVVar2;
  
  pIVar1 = (Io_MvMod_t *)calloc(1,0x88);
  pVVar2 = Vec_PtrAlloc(0x200);
  pIVar1->vInputs = pVVar2;
  pVVar2 = Vec_PtrAlloc(0x200);
  pIVar1->vOutputs = pVVar2;
  pVVar2 = Vec_PtrAlloc(0x200);
  pIVar1->vLatches = pVVar2;
  pVVar2 = Vec_PtrAlloc(0x200);
  pIVar1->vFlops = pVVar2;
  pVVar2 = Vec_PtrAlloc(0x200);
  pIVar1->vResets = pVVar2;
  pVVar2 = Vec_PtrAlloc(0x200);
  pIVar1->vNames = pVVar2;
  pVVar2 = Vec_PtrAlloc(0x200);
  pIVar1->vSubckts = pVVar2;
  pVVar2 = Vec_PtrAlloc(0x200);
  pIVar1->vShorts = pVVar2;
  pVVar2 = Vec_PtrAlloc(0x200);
  pIVar1->vOnehots = pVVar2;
  pVVar2 = Vec_PtrAlloc(0x200);
  pIVar1->vMvs = pVVar2;
  pVVar2 = Vec_PtrAlloc(0x200);
  pIVar1->vConstrs = pVVar2;
  pVVar2 = Vec_PtrAlloc(0x200);
  pIVar1->vLtlProperties = pVVar2;
  return pIVar1;
}

Assistant:

static Io_MvMod_t * Io_MvModAlloc()
{
    Io_MvMod_t * p;
    p = ABC_ALLOC( Io_MvMod_t, 1 );
    memset( p, 0, sizeof(Io_MvMod_t) );
    p->vInputs  = Vec_PtrAlloc( 512 );
    p->vOutputs = Vec_PtrAlloc( 512 );
    p->vLatches = Vec_PtrAlloc( 512 );
    p->vFlops   = Vec_PtrAlloc( 512 );
    p->vResets  = Vec_PtrAlloc( 512 );
    p->vNames   = Vec_PtrAlloc( 512 );
    p->vSubckts = Vec_PtrAlloc( 512 );
    p->vShorts  = Vec_PtrAlloc( 512 );
    p->vOnehots = Vec_PtrAlloc( 512 );
    p->vMvs     = Vec_PtrAlloc( 512 );
    p->vConstrs = Vec_PtrAlloc( 512 );
	p->vLtlProperties = Vec_PtrAlloc( 512 );
    return p;
}